

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::TexturePool::release(TexturePool *this,GLuint id)

{
  GLuint local_14;
  TexturePool *pTStack_10;
  GLuint id_local;
  TexturePool *this_local;
  
  local_14 = id;
  pTStack_10 = this;
  if (id != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,&local_14);
    return;
  }
  __assert_fail("id > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                ,0x3d,"void rengine::OpenGLRenderer::TexturePool::release(GLuint)");
}

Assistant:

void release(GLuint id) {
            assert(id > 0);
            push_back(id);
        }